

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

UChar32 u_charFromName_63(UCharNameChoice nameChoice,char *name,UErrorCode *pErrorCode)

{
  uint *factors;
  uint uVar1;
  UBool UVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  UErrorCode UVar14;
  long lVar15;
  uint *puVar16;
  uint16_t uVar17;
  char *pcVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  uint16_t indexes [8];
  undefined8 local_200;
  char lower [120];
  char *local_178 [8];
  char upper [120];
  FindName findName;
  char *elementBases [8];
  
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0xffff;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0xffff;
  }
  UVar14 = U_ILLEGAL_ARGUMENT_ERROR;
  if ((name != (char *)0x0 && (int)nameChoice < 4) && (*name != '\0')) {
    UVar2 = icu_63::isDataLoaded(pErrorCode);
    if (UVar2 == '\0') {
      return 0xffff;
    }
    uVar19 = 0xfffffffe;
    lVar15 = 0;
    do {
      cVar4 = name[lVar15];
      if (cVar4 == '\0') {
        lower[lVar15] = '\0';
        upper[lVar15] = '\0';
        if (lower[0] != '<') {
          iVar20 = *(int *)((long)&icu_63::uCharNames->tokenStringOffset +
                           (ulong)icu_63::uCharNames->algNamesOffset);
          if (iVar20 == 0) goto LAB_002e8d53;
          puVar16 = (uint *)((long)&icu_63::uCharNames->groupsOffset +
                            (ulong)icu_63::uCharNames->algNamesOffset);
          goto LAB_002e8a96;
        }
        UVar14 = U_ILLEGAL_CHAR_FOUND;
        if (((nameChoice != U_EXTENDED_CHAR_NAME) || (uVar19 + 1 < 3)) ||
           ((lower[uVar19 + 1] != '>' || (lower[uVar19] == '-')))) goto LAB_002e8d8e;
        uVar11 = 2;
        if (uVar19 < 3) goto LAB_002e89c7;
        uVar11 = (ulong)uVar19;
        uVar12 = (ulong)uVar19;
        goto LAB_002e89b1;
      }
      cVar3 = uprv_toupper_63(cVar4);
      upper[lVar15] = cVar3;
      cVar4 = uprv_asciitolower_63(cVar4);
      lower[lVar15] = cVar4;
      lVar15 = lVar15 + 1;
      uVar19 = uVar19 + 1;
    } while (lVar15 != 0x78);
    UVar14 = U_ILLEGAL_CHAR_FOUND;
  }
  goto LAB_002e8d8e;
LAB_002e8a96:
  if ((nameChoice & ~U_EXTENDED_CHAR_NAME) == U_UNICODE_CHAR_NAME) {
    if ((char)puVar16[2] != '\x01') {
      if ((char)puVar16[2] == '\0') {
        lVar15 = 0;
        do {
          cVar4 = *(char *)((long)puVar16 + lVar15 + 0xc);
          if (cVar4 == '\0') {
            uVar10 = (ushort)*(byte *)((long)puVar16 + 9);
            pcVar9 = upper + lVar15;
            uVar19 = 0;
            if (*(byte *)((long)puVar16 + 9) != 0) goto LAB_002e8b38;
            goto LAB_002e8b6e;
          }
          pcVar9 = upper + lVar15;
          lVar15 = lVar15 + 1;
        } while (cVar4 == *pcVar9);
      }
      goto LAB_002e8a9f;
    }
    factors = puVar16 + 3;
    bVar5 = *(byte *)((long)puVar16 + 9);
    pcVar13 = (char *)((long)puVar16 + (ulong)bVar5 * 2 + 0xd);
    pcVar9 = upper;
    do {
      pcVar18 = pcVar13 + -1;
      if (*pcVar18 == '\0') {
        uVar19 = *puVar16;
        uVar1 = puVar16[1];
        icu_63::writeFactorSuffix
                  ((uint16_t *)factors,(ushort)bVar5,pcVar13,0,indexes,elementBases,local_178,
                   (char *)&findName,0x40);
        iVar6 = strcmp(pcVar9,(char *)&findName);
        if (iVar6 == 0) goto LAB_002e8d36;
        if ((int)(uVar1 + 1) <= (int)(uVar19 + 1)) goto LAB_002e8a9f;
        uVar7 = bVar5 - 1 & 0xffff;
        local_200 = (ulong)uVar7;
        uVar11 = (ulong)(uVar7 * 2);
        uVar19 = uVar19 + 1;
        goto LAB_002e8c28;
      }
      pcVar13 = pcVar13 + 1;
      cVar4 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    } while (*pcVar18 == cVar4);
    uVar19 = 0xffff;
    goto LAB_002e8d36;
  }
  goto LAB_002e8a9f;
  while( true ) {
    pcVar9 = pcVar9 + 1;
    uVar19 = uVar19 << 4 | iVar6 + cVar4;
    uVar10 = uVar10 - 1;
    if (uVar10 == 0) break;
LAB_002e8b38:
    cVar4 = *pcVar9;
    iVar6 = -0x30;
    if ((9 < (byte)(cVar4 - 0x30U)) && (iVar6 = -0x37, 5 < (byte)(cVar4 + 0xbfU)))
    goto LAB_002e8a9f;
  }
LAB_002e8b6e:
  if (((*pcVar9 == '\0') && (*puVar16 <= uVar19)) && (uVar19 <= puVar16[1])) {
LAB_002e8d36:
    if (uVar19 != 0xffff) {
      return uVar19;
    }
  }
LAB_002e8a9f:
  puVar16 = (uint *)((long)puVar16 + (ulong)*(ushort *)((long)puVar16 + 10));
  iVar20 = iVar20 + -1;
  if (iVar20 == 0) goto LAB_002e8d53;
  goto LAB_002e8a96;
LAB_002e8c28:
  do {
    uVar17 = *(short *)((long)indexes + uVar11) + 1;
    uVar12 = local_200;
    uVar7 = bVar5 - 2;
    if (*(ushort *)((long)factors + uVar11) <= uVar17) {
      do {
        indexes[uVar12] = 0;
        local_178[uVar12] = elementBases[uVar12];
        uVar12 = (ulong)(uVar7 & 0xffff);
        uVar8 = (ulong)((uVar7 & 0xffff) * 2);
        uVar17 = *(short *)((long)indexes + uVar8) + 1;
        uVar7 = uVar7 - 1;
      } while (*(ushort *)((long)factors + uVar8) <= uVar17);
    }
    indexes[uVar12] = uVar17;
    pcVar13 = local_178[uVar12];
    do {
      cVar4 = *pcVar13;
      pcVar13 = pcVar13 + 1;
    } while (cVar4 != '\0');
    local_178[uVar12] = pcVar13;
    pcVar13 = pcVar9;
    if (bVar5 == 0) {
LAB_002e8ce8:
      if (*pcVar13 == '\0') goto LAB_002e8d36;
    }
    else {
      uVar10 = 0;
      do {
        pcVar18 = local_178[uVar10];
        cVar4 = *pcVar18;
        while (cVar4 != '\0') {
          pcVar18 = pcVar18 + 1;
          if (cVar4 != *pcVar13) {
            pcVar18 = "";
            uVar10 = 99;
          }
          pcVar13 = pcVar13 + 1;
          cVar4 = *pcVar18;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < bVar5);
      if (uVar10 < 99) goto LAB_002e8ce8;
    }
    bVar21 = uVar19 != uVar1;
    uVar19 = uVar19 + 1;
  } while (bVar21);
  goto LAB_002e8a9f;
LAB_002e8d53:
  findName.otherName = upper;
  findName.code = 0xffff;
  icu_63::enumNames(icu_63::uCharNames,0,0x110000,(UEnumCharNamesFn *)0x0,&findName,nameChoice);
  UVar14 = U_ILLEGAL_CHAR_FOUND;
  if (findName.code != 0xffff) {
    return findName.code;
  }
  goto LAB_002e8d8e;
  while (uVar12 = uVar8, 2 < uVar8) {
LAB_002e89b1:
    uVar8 = uVar12 - 1;
    uVar11 = (ulong)((int)uVar11 - 1);
    if (lower[uVar12 - 1] == '-') break;
  }
LAB_002e89c7:
  if (lower[uVar11] == '-') {
    lower[uVar11] = '\0';
    uVar12 = (ulong)((int)uVar11 + 1);
    cVar4 = lower[uVar12];
    iVar20 = 0;
    if (cVar4 != '>') {
      uVar19 = (int)uVar11 + 2;
      iVar20 = 0;
      do {
        iVar6 = -0x30;
        if ((9 < (byte)(cVar4 - 0x30U)) && (iVar6 = -0x57, 5 < (byte)(cVar4 + 0x9fU)))
        goto LAB_002e8d8e;
        iVar20 = iVar20 * 0x10 + iVar6 + (int)cVar4;
        uVar12 = (ulong)uVar19;
        cVar4 = lower[uVar12];
        uVar19 = uVar19 + 1;
      } while (cVar4 != '>');
    }
    lower[uVar12] = '\0';
    lVar15 = 0;
    do {
      iVar6 = strcmp(lower + 1,*(char **)((long)&icu_63::charCatNames + lVar15));
      if (iVar6 == 0) {
        bVar5 = icu_63::getCharCat(iVar20);
        if ((ulong)bVar5 * 8 == lVar15) {
          return iVar20;
        }
        break;
      }
      lVar15 = lVar15 + 8;
    } while (lVar15 != 0x108);
  }
LAB_002e8d8e:
  *pErrorCode = UVar14;
  return 0xffff;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_charFromName(UCharNameChoice nameChoice,
               const char *name,
               UErrorCode *pErrorCode) {
    char upper[120], lower[120];
    FindName findName;
    AlgorithmicRange *algRange;
    uint32_t *p;
    uint32_t i;
    UChar32 cp = 0;
    char c0;
    UChar32 error = 0xffff;     /* Undefined, but use this for backwards compatibility. */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return error;
    }

    if(nameChoice>=U_CHAR_NAME_CHOICE_COUNT || name==NULL || *name==0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return error;
    }

    if(!isDataLoaded(pErrorCode)) {
        return error;
    }

    /* construct the uppercase and lowercase of the name first */
    for(i=0; i<sizeof(upper); ++i) {
        if((c0=*name++)!=0) {
            upper[i]=uprv_toupper(c0);
            lower[i]=uprv_tolower(c0);
        } else {
            upper[i]=lower[i]=0;
            break;
        }
    }
    if(i==sizeof(upper)) {
        /* name too long, there is no such character */
        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }
    // i==strlen(name)==strlen(lower)==strlen(upper)

    /* try extended names first */
    if (lower[0] == '<') {
        if (nameChoice == U_EXTENDED_CHAR_NAME) {
            // Parse a string like "<category-HHHH>" where HHHH is a hex code point.
            if (lower[--i] == '>' && i >= 3 && lower[--i] != '-') {
                while (i >= 3 && lower[--i] != '-') {}

                if (i >= 2 && lower[i] == '-') {
                    uint32_t cIdx;

                    lower[i] = 0;

                    for (++i; lower[i] != '>'; ++i) {
                        if (lower[i] >= '0' && lower[i] <= '9') {
                            cp = (cp << 4) + lower[i] - '0';
                        } else if (lower[i] >= 'a' && lower[i] <= 'f') {
                            cp = (cp << 4) + lower[i] - 'a' + 10;
                        } else {
                            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                            return error;
                        }
                    }

                    /* Now validate the category name.
                       We could use a binary search, or a trie, if
                       we really wanted to. */

                    for (lower[i] = 0, cIdx = 0; cIdx < UPRV_LENGTHOF(charCatNames); ++cIdx) {

                        if (!uprv_strcmp(lower + 1, charCatNames[cIdx])) {
                            if (getCharCat(cp) == cIdx) {
                                return cp;
                            }
                            break;
                        }
                    }
                }
            }
        }

        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }

    /* try algorithmic names now */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    i=*p;
    algRange=(AlgorithmicRange *)(p+1);
    while(i>0) {
        if((cp=findAlgName(algRange, nameChoice, upper))!=0xffff) {
            return cp;
        }
        algRange=(AlgorithmicRange *)((uint8_t *)algRange+algRange->size);
        --i;
    }

    /* normal character name */
    findName.otherName=upper;
    findName.code=error;
    enumNames(uCharNames, 0, UCHAR_MAX_VALUE + 1, DO_FIND_NAME, &findName, nameChoice);
    if (findName.code == error) {
         *pErrorCode = U_ILLEGAL_CHAR_FOUND;
    }
    return findName.code;
}